

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

property_name_and_value * __thiscall
mjs::parser::parse_property_name_and_value
          (property_name_and_value *__return_storage_ptr__,parser *this)

{
  _func_int **pp_Var1;
  int iVar2;
  int iVar3;
  wstring *pwVar4;
  wostream *pwVar5;
  expression *e;
  pointer *__ptr;
  _func_int **pp_Var6;
  wchar_t *in_R9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  wstring_view message;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> id;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> __str;
  undefined1 local_268 [16];
  undefined1 local_258 [32];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_238;
  undefined8 local_218;
  undefined4 local_210;
  undefined4 local_20c;
  undefined1 local_208 [32];
  size_t local_1e8;
  undefined1 local_1e0 [24];
  undefined1 local_1c8 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_1b8 [22];
  token local_50;
  
  local_268._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  parse_property_name((parser *)local_1c8);
  p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._0_8_;
  local_268._8_8_ = local_1c8._0_8_;
  if (((1 < (int)this->version_) && ((this->current_token_).type_ != colon)) &&
     (iVar2 = (**(code **)(*(long *)local_1c8._0_8_ + 0x18))(local_1c8._0_8_), iVar2 == 0)) {
    iVar2 = std::__cxx11::wstring::compare((wchar_t *)((long)p_Var7 + 0x20));
    if ((iVar2 == 0) ||
       (iVar3 = std::__cxx11::wstring::compare((wchar_t *)((long)p_Var7 + 0x20)), iVar3 == 0)) {
      parse_property_name((parser *)local_268);
      pp_Var1 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)p_Var7 + 0x20))->
                _vptr__Sp_counted_base;
      local_1c8._0_8_ = local_1b8;
      std::__cxx11::wstring::_M_construct<wchar_t*>
                ((wstring *)local_1c8,pp_Var1,(long)pp_Var1 + *(long *)((long)p_Var7 + 0x28) * 4);
      std::__cxx11::wstring::append((wchar_t *)local_1c8);
      property_name_string_abi_cxx11_((wstring *)local_258,(mjs *)local_268._0_8_,e);
      pp_Var1 = (_func_int **)
                ((long)(_func_int ***)local_1c8._8_8_ + (long)(_Alloc_hider *)local_258._8_8_);
      pp_Var6 = (_func_int **)0x3;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._0_8_ != local_1b8) {
        pp_Var6 = local_1b8[0]._vptr__Sp_counted_base;
      }
      if (pp_Var6 < pp_Var1) {
        in_R9 = (wchar_t *)(local_258 + 0x10);
        pp_Var6 = (_func_int **)0x3;
        if ((wchar_t *)local_258._0_8_ != in_R9) {
          pp_Var6 = (_func_int **)local_258._16_8_;
        }
        if (pp_Var6 < pp_Var1) goto LAB_00174ca0;
        pwVar4 = (wstring *)
                 std::__cxx11::wstring::replace((ulong)local_258,0,(wchar_t *)0x0,local_1c8._0_8_);
      }
      else {
LAB_00174ca0:
        pwVar4 = (wstring *)std::__cxx11::wstring::_M_append((wchar_t *)local_1c8,local_258._0_8_);
      }
      std::__cxx11::wstring::wstring((wstring *)local_208,pwVar4);
      if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
        operator_delete((void *)local_258._0_8_,local_258._16_8_ * 4 + 4);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._0_8_ != local_1b8) {
        operator_delete((void *)local_1c8._0_8_,(long)local_1b8[0]._vptr__Sp_counted_base * 4 + 4);
      }
      parse_function_abi_cxx11_
                ((tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
                  *)local_258,this);
      if ((long)(local_258._16_8_ - local_258._8_8_) >> 5 != (ulong)(iVar2 != 0)) {
        std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1c8);
        pwVar5 = std::operator<<((wostream *)local_1c8,"Wrong number of arguments to ");
        pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (pwVar5,(wchar_t *)
                                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   ((long)p_Var7 + 0x20))->_vptr__Sp_counted_base,
                            *(long *)((long)p_Var7 + 0x28));
        pwVar5 = std::operator<<(pwVar5," ");
        pwVar5 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar5);
        pwVar5 = std::operator<<(pwVar5," expected ");
        std::wostream::_M_insert<unsigned_long>((ulong)pwVar5);
        local_238.field_2._8_8_ =
             (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        local_218 = (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218)->_M_use_count + 1;
          }
        }
        local_210 = this->token_start_;
        local_20c = (undefined4)(this->lexer_).text_pos_;
        std::__cxx11::wstringbuf::str();
        message._M_str = in_R9;
        message._M_len = local_1e8;
        syntax_error((parser *)"parse_property_name_and_value",(char *)0x449,(int)&local_238 + 0x18,
                     (source_extend *)local_1e0._0_8_,message);
      }
      make_expression<mjs::function_expression,mjs::source_extend&,std::__cxx11::wstring_const&,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                ((parser *)local_1c8,(source_extend *)this,&local_238,
                 (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                  *)local_208,
                 (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)(local_258 + 8)
                );
      property_name_and_value::property_name_and_value
                (__return_storage_ptr__,set - (iVar2 == 0),(expression_ptr *)local_268,
                 (expression_ptr *)local_1c8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (**(code **)(*(long *)local_1c8._0_8_ + 8))();
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._M_string_length);
      }
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)(local_258 + 8));
      if ((wchar_t *)local_258._0_8_ != (wchar_t *)0x0) {
        (**(code **)(*(long *)local_258._0_8_ + 8))();
      }
      if ((pointer)local_208._0_8_ != (pointer)(local_208 + 0x10)) {
        operator_delete((void *)local_208._0_8_,local_208._16_8_ * 4 + 4);
      }
      if ((element_type *)local_268._0_8_ != (element_type *)0x0) {
        (*((syntax_node *)local_268._0_8_)->_vptr_syntax_node[1])();
      }
      goto LAB_00174bb3;
    }
  }
  expect(&local_50,this,colon,"parse_property_name_and_value",0x451);
  token::destroy(&local_50);
  parse_assignment_expression((parser *)local_1c8);
  property_name_and_value::property_name_and_value
            (__return_storage_ptr__,normal,(expression_ptr *)(local_268 + 8),
             (expression_ptr *)local_1c8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (**(code **)(*(long *)local_1c8._0_8_ + 8))();
  }
  p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    return __return_storage_ptr__;
  }
LAB_00174bb3:
  (*p_Var7->_vptr__Sp_counted_base[1])(p_Var7);
  return __return_storage_ptr__;
}

Assistant:

property_name_and_value parser::parse_property_name_and_value() {
    expression_ptr p;
    {
        p = parse_property_name();
        // get/set i.e. accessor properties
        if (version_ >= version::es5 && current_token_type() != token_type::colon && p->type() == expression_type::identifier) {
            const auto& p_id = static_cast<const identifier_expression&>(*p).id();
            const bool is_get = p_id == L"get";
            if (is_get || p_id == L"set") {
                auto new_p = parse_property_name();
                const auto id = p_id + L" " + property_name_string(*new_p);
                auto [extend, params, block] = parse_function();
                const size_t expected_args = is_get ? 0 : 1;
                if (expected_args != params.size()) {
                    SYNTAX_ERROR("Wrong number of arguments to " << p_id << " " << params.size() << " expected " << expected_args);
                }

                auto f = make_expression<function_expression>(extend, id, std::move(params), std::move(block));
                return property_name_and_value{is_get ? property_assignment_type::get : property_assignment_type::set, std::move(new_p), std::move(f)};
            }
        }
    }
    EXPECT(token_type::colon);
    return property_name_and_value{property_assignment_type::normal, std::move(p), parse_assignment_expression()};
}